

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

void __thiscall QSQLiteResult::~QSQLiteResult(QSQLiteResult *this)

{
  QSQLiteResultPrivate *this_00;
  QSQLiteDriverPrivate *pQVar1;
  EVP_PKEY_CTX *in_RSI;
  QSQLiteResult **in_RDI;
  long in_FS_OFFSET;
  QSQLiteResultPrivate *d;
  EVP_PKEY_CTX local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = (QSQLiteResult *)&PTR__QSQLiteResult_002e3220;
  this_00 = d_func((QSQLiteResult *)0x115557);
  pQVar1 = QSQLiteResultPrivate::drv_d_func(this_00);
  if (pQVar1 != (QSQLiteDriverPrivate *)0x0) {
    QSQLiteResultPrivate::drv_d_func(this_00);
    in_RSI = local_10;
    QList<QSQLiteResult*>::removeOne<QSQLiteResult*>((QList<QSQLiteResult_*> *)this_00,in_RDI);
  }
  QSQLiteResultPrivate::cleanup(this_00,in_RSI);
  QSqlCachedResult::~QSqlCachedResult((QSqlCachedResult *)0x1155a6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSQLiteResult::~QSQLiteResult()
{
    Q_D(QSQLiteResult);
    if (d->drv_d_func())
        const_cast<QSQLiteDriverPrivate*>(d->drv_d_func())->results.removeOne(this);
    d->cleanup();
}